

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int xmlListInsert(xmlListPtr l,void *data)

{
  xmlGenericErrorFunc p_Var1;
  _xmlLink *p_Var2;
  xmlLinkPtr pxVar3;
  _xmlLink *p_Var4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlLinkPtr lkNew;
  xmlLinkPtr lkPlace;
  void *data_local;
  xmlListPtr l_local;
  
  if (l == (xmlListPtr)0x0) {
    l_local._4_4_ = 1;
  }
  else {
    pxVar3 = xmlListLowerSearch(l,data);
    p_Var4 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var4 == (_xmlLink *)0x0) {
      pp_Var5 = __xmlGenericError();
      p_Var1 = *pp_Var5;
      ppvVar6 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar6,"Cannot initialize memory for new link");
      l_local._4_4_ = 1;
    }
    else {
      p_Var4->data = data;
      p_Var2 = pxVar3->prev;
      p_Var4->next = p_Var2->next;
      p_Var2->next->prev = p_Var4;
      p_Var2->next = p_Var4;
      p_Var4->prev = p_Var2;
      l_local._4_4_ = 0;
    }
  }
  return l_local._4_4_;
}

Assistant:

int
xmlListInsert(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListLowerSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (1);
    }
    lkNew->data = data;
    lkPlace = lkPlace->prev;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}